

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

int expansion_sum_zeroelim2(int elen,double *e,int flen,double *f,double *h)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = *f;
  if (elen < 1) {
    iVar1 = 0;
  }
  else {
    uVar3 = 0;
    iVar1 = 0;
    dVar7 = dVar6;
    do {
      dVar6 = dVar7 + e[uVar3];
      dVar7 = (dVar7 - (dVar6 - (dVar6 - dVar7))) + (e[uVar3] - (dVar6 - dVar7));
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        lVar5 = (long)iVar1;
        iVar1 = iVar1 + 1;
        h[lVar5] = dVar7;
      }
      uVar3 = uVar3 + 1;
      dVar7 = dVar6;
    } while ((uint)elen != uVar3);
  }
  h[iVar1] = dVar6;
  if (1 < flen) {
    uVar3 = 1;
    do {
      dVar6 = f[uVar3];
      if (iVar1 < 0) {
        iVar1 = 0;
      }
      else {
        uVar2 = iVar1 + 1;
        uVar4 = 0;
        iVar1 = 0;
        dVar7 = dVar6;
        do {
          dVar6 = dVar7 + h[uVar4];
          dVar7 = (dVar7 - (dVar6 - (dVar6 - dVar7))) + (h[uVar4] - (dVar6 - dVar7));
          if ((dVar7 != 0.0) || (NAN(dVar7))) {
            lVar5 = (long)iVar1;
            iVar1 = iVar1 + 1;
            h[lVar5] = dVar7;
          }
          uVar4 = uVar4 + 1;
          dVar7 = dVar6;
        } while (uVar2 != uVar4);
      }
      h[iVar1] = dVar6;
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)flen);
  }
  return iVar1 + 1;
}

Assistant:

int expansion_sum_zeroelim2(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* e and h can be the same, but f and h cannot. */
{
  REAL Q, hh;
  INEXACT REAL Qnew;
  int eindex, findex, hindex, hlast;
  REAL enow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;

  hindex = 0;
  Q = f[0];
  for (eindex = 0; eindex < elen; eindex++) {
    enow = e[eindex];
    Two_Sum(Q, enow, Qnew, hh);
    Q = Qnew;
    if (hh != 0.0) {
      h[hindex++] = hh;
    }
  }
  h[hindex] = Q;
  hlast = hindex;
  for (findex = 1; findex < flen; findex++) {
    hindex = 0;
    Q = f[findex];
    for (eindex = 0; eindex <= hlast; eindex++) {
      enow = h[eindex];
      Two_Sum(Q, enow, Qnew, hh);
      Q = Qnew;
      if (hh != 0) {
        h[hindex++] = hh;
      }
    }
    h[hindex] = Q;
    hlast = hindex;
  }
  return hlast + 1;
}